

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O3

int32_t utf8IteratorMove(UCharIterator *iter,int32_t delta,UCharIteratorOrigin origin)

{
  byte bVar1;
  uint8_t *s;
  uint uVar2;
  UChar32 UVar3;
  undefined8 in_RAX;
  uint uVar4;
  int32_t *piVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  bool bVar16;
  undefined8 uStack_38;
  ulong uVar9;
  
  switch(origin) {
  case UITER_START:
  case UITER_ZERO:
    goto switchD_002ddd1d_caseD_0;
  case UITER_CURRENT:
    uVar2 = iter->index;
    if (-1 < (int)uVar2) {
      delta = delta + uVar2;
      goto switchD_002ddd1d_caseD_0;
    }
    if (delta == 0) {
      return -2;
    }
    uStack_38._4_4_ = iter->start;
LAB_002dde1b:
    if (uStack_38._4_4_ == -delta ||
        SBORROW4(uStack_38._4_4_,-delta) != (int)(uStack_38._4_4_ + delta) < 0) goto LAB_002dde4f;
    if ((int)(iter->limit - uStack_38._4_4_) <= delta) {
      iVar8 = iter->length;
      iter->index = iVar8;
      iter->start = iter->limit;
      iter->reservedField = 0;
      if (iVar8 < 0) {
        return -2;
      }
      return iVar8;
    }
    goto LAB_002ddde4;
  case UITER_LIMIT:
  case UITER_LENGTH:
    break;
  default:
    return -1;
  }
  if (iter->length < 0) {
    iter->index = -1;
    uStack_38._4_4_ = iter->limit;
    iter->start = uStack_38._4_4_;
    iter->reservedField = 0;
    if (-1 < delta) {
      return -2;
    }
    uVar2 = 0xffffffff;
    goto LAB_002dde1b;
  }
  delta = delta + iter->length;
switchD_002ddd1d_caseD_0:
  if (delta < 1) {
LAB_002dde4f:
    iter->reservedField = 0;
    iter->start = 0;
    iter->index = 0;
    return 0;
  }
  uVar10 = iter->length;
  if (uVar10 <= (uint)delta) {
    iter->index = uVar10;
    iter->start = iter->limit;
    iter->reservedField = 0;
    return uVar10;
  }
  piVar5 = &iter->index;
  uVar2 = *piVar5;
  if ((int)uVar2 < 0 || (uint)delta < uVar2 >> 1) {
    iter->reservedField = 0;
    iter->start = 0;
    uVar2 = 0;
LAB_002dddd4:
    *piVar5 = 0;
  }
  else if ((-1 < (int)uVar10) && ((int)(uVar10 - delta) < (int)(delta - uVar2))) {
    iter->index = uVar10;
    iter->start = iter->limit;
    piVar5 = &iter->reservedField;
    uVar2 = uVar10;
    goto LAB_002dddd4;
  }
  delta = delta - uVar2;
  if (delta == 0) {
    return uVar2;
  }
  uStack_38._4_4_ = iter->start;
LAB_002ddde4:
  uVar6 = (ulong)uStack_38._4_4_;
  s = (uint8_t *)iter->context;
  if (delta < 1) {
    if (iter->reservedField != 0) {
      iter->reservedField = 0;
      uVar6 = (ulong)(uStack_38._4_4_ - 4);
      uVar2 = uVar2 - 1;
      delta = delta + 1;
    }
    uStack_38._4_4_ = (uint)uVar6;
    uVar10 = uVar2;
    do {
      if ((-1 < delta) || (uVar2 = (uint)uVar6, uStack_38._4_4_ = uVar2, (int)uVar2 < 1))
      goto LAB_002de06b;
      uStack_38 = CONCAT44(uVar2 - 1,(int)in_RAX);
      iVar15 = 1;
      iVar8 = -1;
      if (((char)s[uVar2 - 1] < '\0') &&
         (UVar3 = utf8_prevCharSafeBody_63
                            (s,0,(int32_t *)((long)&uStack_38 + 4),(uint)s[uVar2 - 1],-3),
         0xffff < UVar3)) {
        if (-2 < delta) {
          iter->reservedField = UVar3;
          uVar10 = uVar10 - 1;
          uStack_38._4_4_ = uStack_38._4_4_ + 4;
          goto LAB_002de06b;
        }
        iVar15 = 2;
        iVar8 = -2;
      }
      uVar10 = uVar10 + iVar8;
      delta = delta + iVar15;
      uVar6 = (ulong)uStack_38._4_4_;
      in_RAX = uStack_38;
    } while( true );
  }
  uVar10 = uVar2;
  if (iter->reservedField != 0) {
    iter->reservedField = 0;
    delta = delta + -1;
    uVar10 = uVar2 + 1;
  }
  uVar4 = iter->limit;
  iVar8 = 0;
  if ((delta == 0) || ((int)uVar4 <= (int)uStack_38._4_4_)) {
    iVar15 = 0;
  }
  else {
    do {
      lVar12 = (long)(int)uVar6;
      uVar9 = lVar12 + 1;
      bVar1 = s[lVar12];
      iVar8 = -1;
      iVar15 = 1;
      uVar6 = uVar9;
      if ((uint)uVar9 != uVar4 && (char)bVar1 < '\0') {
        if (bVar1 < 0xe0) {
          if (0xc1 < bVar1) {
            uVar11 = bVar1 & 0x1f;
LAB_002ddfa6:
            uVar6 = uVar9;
            if ((byte)(s[(int)uVar9] ^ 0x80) < 0x40) {
              uStack_38._4_4_ = (int)uVar9 + 1;
              uVar6 = (ulong)uStack_38._4_4_;
              if (0x3ff < uVar11) {
                if (delta < 2) {
                  iter->reservedField = uVar11 << 6 | s[(int)uVar9] ^ 0x80;
                  uVar10 = uVar10 + 1;
                  iVar15 = 1;
                  iVar8 = -1;
                  goto LAB_002de053;
                }
                iVar8 = -2;
                iVar15 = 2;
              }
            }
          }
        }
        else if (bVar1 < 0xf0) {
          uVar11 = bVar1 & 0xf;
          if (((byte)" 000000000000\x1000"[uVar11] >> (s[uVar9] >> 5) & 1) != 0) {
            bVar14 = s[uVar9] & 0x3f;
LAB_002ddf82:
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            uVar6 = (ulong)uVar4;
            if (uVar7 != uVar4) {
              uVar11 = (uint)bVar14 | uVar11 << 6;
              goto LAB_002ddfa6;
            }
          }
        }
        else if (bVar1 < 0xf5) {
          if ((((uint)(int)""[s[uVar9] >> 4] >> (bVar1 - 0xf0 & 0x1f) & 1) != 0) &&
             (uVar13 = lVar12 + 2, uVar6 = (ulong)uVar4, (uint)uVar13 != uVar4)) {
            bVar14 = s[uVar13] + 0x80;
            if (bVar14 < 0x40) {
              uVar11 = s[uVar9] & 0x3f | (bVar1 - 0xf0) * 0x40;
              uVar9 = uVar13 & 0xffffffff;
              goto LAB_002ddf82;
            }
            uVar6 = uVar13 & 0xffffffff;
          }
        }
      }
      uStack_38._4_4_ = (uint)uVar6;
      uVar10 = uVar10 + iVar15;
      bVar16 = SCARRY4(delta,iVar8);
      delta = delta + iVar8;
    } while ((delta != 0 && bVar16 == delta < 0) && ((int)uStack_38._4_4_ < (int)uVar4));
    iVar15 = 0;
    iVar8 = 0;
  }
LAB_002de053:
  if (uStack_38._4_4_ == uVar4) {
    uStack_38._4_4_ = uVar4;
    if (iter->length < 0) {
      if (-1 < (int)uVar2) {
        iter->length = iVar15 + uVar10;
      }
    }
    else if ((int)uVar2 < 0) {
      iVar8 = iter->length + iVar8;
      iter->index = iVar8;
      goto LAB_002de06e;
    }
  }
LAB_002de06b:
  uVar4 = uStack_38._4_4_;
  iVar8 = iter->index;
LAB_002de06e:
  iter->start = uVar4;
  if (iVar8 < 0) {
    uVar10 = 0xfffffffe;
    if ((int)uVar4 < 2) {
      iter->index = uVar4;
      uVar10 = uVar4;
    }
  }
  else {
    iter->index = uVar10;
  }
  return uVar10;
}

Assistant:

static int32_t U_CALLCONV
utf8IteratorMove(UCharIterator *iter, int32_t delta, UCharIteratorOrigin origin) {
    const uint8_t *s;
    UChar32 c;
    int32_t pos; /* requested UTF-16 index */
    int32_t i; /* UTF-8 index */
    UBool havePos;

    /* calculate the requested UTF-16 index */
    switch(origin) {
    case UITER_ZERO:
    case UITER_START:
        pos=delta;
        havePos=TRUE;
        /* iter->index<0 (unknown) is possible */
        break;
    case UITER_CURRENT:
        if(iter->index>=0) {
            pos=iter->index+delta;
            havePos=TRUE;
        } else {
            /* the current UTF-16 index is unknown after setState(), use only delta */
            pos=0;
            havePos=FALSE;
        }
        break;
    case UITER_LIMIT:
    case UITER_LENGTH:
        if(iter->length>=0) {
            pos=iter->length+delta;
            havePos=TRUE;
        } else {
            /* pin to the end, avoid counting the length */
            iter->index=-1;
            iter->start=iter->limit;
            iter->reservedField=0;
            if(delta>=0) {
                return UITER_UNKNOWN_INDEX;
            } else {
                /* the current UTF-16 index is unknown, use only delta */
                pos=0;
                havePos=FALSE;
            }
        }
        break;
    default:
        return -1;  /* Error */
    }

    if(havePos) {
        /* shortcuts: pinning to the edges of the string */
        if(pos<=0) {
            iter->index=iter->start=iter->reservedField=0;
            return 0;
        } else if(iter->length>=0 && pos>=iter->length) {
            iter->index=iter->length;
            iter->start=iter->limit;
            iter->reservedField=0;
            return iter->index;
        }

        /* minimize the number of U8_NEXT/PREV operations */
        if(iter->index<0 || pos<iter->index/2) {
            /* go forward from the start instead of backward from the current index */
            iter->index=iter->start=iter->reservedField=0;
        } else if(iter->length>=0 && (iter->length-pos)<(pos-iter->index)) {
            /*
             * if we have the UTF-16 index and length and the new position is
             * closer to the end than the current index,
             * then go backward from the end instead of forward from the current index
             */
            iter->index=iter->length;
            iter->start=iter->limit;
            iter->reservedField=0;
        }

        delta=pos-iter->index;
        if(delta==0) {
            return iter->index; /* nothing to do */
        }
    } else {
        /* move relative to unknown UTF-16 index */
        if(delta==0) {
            return UITER_UNKNOWN_INDEX; /* nothing to do */
        } else if(-delta>=iter->start) {
            /* moving backwards by more UChars than there are UTF-8 bytes, pin to 0 */
            iter->index=iter->start=iter->reservedField=0;
            return 0;
        } else if(delta>=(iter->limit-iter->start)) {
            /* moving forward by more UChars than the remaining UTF-8 bytes, pin to the end */
            iter->index=iter->length; /* may or may not be <0 (unknown) */
            iter->start=iter->limit;
            iter->reservedField=0;
            return iter->index>=0 ? iter->index : (int32_t)UITER_UNKNOWN_INDEX;
        }
    }

    /* delta!=0 */

    /* move towards the requested position, pin to the edges of the string */
    s=(const uint8_t *)iter->context;
    pos=iter->index; /* could be <0 (unknown) */
    i=iter->start;
    if(delta>0) {
        /* go forward */
        int32_t limit=iter->limit;
        if(iter->reservedField!=0) {
            iter->reservedField=0;
            ++pos;
            --delta;
        }
        while(delta>0 && i<limit) {
            U8_NEXT_OR_FFFD(s, i, limit, c);
            if(c<=0xffff) {
                ++pos;
                --delta;
            } else if(delta>=2) {
                pos+=2;
                delta-=2;
            } else /* delta==1 */ {
                /* stop in the middle of a supplementary code point */
                iter->reservedField=c;
                ++pos;
                break; /* delta=0; */
            }
        }
        if(i==limit) {
            if(iter->length<0 && iter->index>=0) {
                iter->length= iter->reservedField==0 ? pos : pos+1;
            } else if(iter->index<0 && iter->length>=0) {
                iter->index= iter->reservedField==0 ? iter->length : iter->length-1;
            }
        }
    } else /* delta<0 */ {
        /* go backward */
        if(iter->reservedField!=0) {
            iter->reservedField=0;
            i-=4; /* we stayed behind the supplementary code point; go before it now */
            --pos;
            ++delta;
        }
        while(delta<0 && i>0) {
            U8_PREV_OR_FFFD(s, 0, i, c);
            if(c<=0xffff) {
                --pos;
                ++delta;
            } else if(delta<=-2) {
                pos-=2;
                delta+=2;
            } else /* delta==-1 */ {
                /* stop in the middle of a supplementary code point */
                i+=4; /* back to behind this supplementary code point for consistent state */
                iter->reservedField=c;
                --pos;
                break; /* delta=0; */
            }
        }
    }

    iter->start=i;
    if(iter->index>=0) {
        return iter->index=pos;
    } else {
        /* we started with index<0 (unknown) so pos is bogus */
        if(i<=1) {
            return iter->index=i; /* reached the beginning */
        } else {
            /* we still don't know the UTF-16 index */
            return UITER_UNKNOWN_INDEX;
        }
    }
}